

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::Key(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      *this,Context *context,Ch *str,SizeType len,bool param_4)

{
  uint uVar1;
  SchemaType *pSVar2;
  bool bVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *name;
  ValueType *this_00;
  Ch *pCVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_48;
  SizeType local_38;
  uint local_34;
  SizeType index;
  SizeType i;
  bool param_4_local;
  Ch *pCStack_28;
  SizeType len_local;
  Ch *str_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  index._3_1_ = param_4;
  i = len;
  pCStack_28 = str;
  str_local = (Ch *)context;
  context_local = (Context *)this;
  if (this->patternProperties_ != (PatternProperty *)0x0) {
    context->patternPropertiesSchemaCount = 0;
    for (local_34 = 0; local_34 < this->patternPropertyCount_; local_34 = local_34 + 1) {
      if ((this->patternProperties_[local_34].pattern != (RegexType *)0x0) &&
         (bVar3 = IsPatternMatch(this->patternProperties_[local_34].pattern,pCStack_28,i), bVar3)) {
        pSVar2 = this->patternProperties_[local_34].schema;
        uVar1 = *(uint *)(str_local + 0x70);
        *(uint *)(str_local + 0x70) = uVar1 + 1;
        *(SchemaType **)(*(long *)(str_local + 0x68) + (ulong)uVar1 * 8) = pSVar2;
        *(SchemaType **)(str_local + 0x20) = this->typeless_;
      }
    }
  }
  local_38 = 0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(&local_48,pCStack_28,i);
  name = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::Move(&local_48);
  bVar3 = FindPropertyIndex(this,name,&local_38);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_48);
  if (bVar3) {
    if (*(int *)(str_local + 0x70) == 0) {
      *(SchemaType **)(str_local + 0x20) = this->properties_[local_38].schema;
    }
    else {
      pSVar2 = this->properties_[local_38].schema;
      uVar1 = *(uint *)(str_local + 0x70);
      *(uint *)(str_local + 0x70) = uVar1 + 1;
      *(SchemaType **)(*(long *)(str_local + 0x68) + (ulong)uVar1 * 8) = pSVar2;
      *(SchemaType **)(str_local + 0x20) = this->typeless_;
      str_local[0x74] = '\x01';
      str_local[0x75] = '\0';
      str_local[0x76] = '\0';
      str_local[0x77] = '\0';
    }
    if (*(long *)(str_local + 0x80) != 0) {
      *(undefined1 *)(*(long *)(str_local + 0x80) + (ulong)local_38) = 1;
    }
    this_local._7_1_ = true;
  }
  else if (this->additionalPropertiesSchema_ == (SchemaType *)0x0) {
    if ((this->additionalProperties_ & 1U) == 0) {
      if (*(int *)(str_local + 0x70) == 0) {
        *(SchemaType **)(str_local + 0x20) = this->typeless_;
        (**(code **)(**(long **)(str_local + 8) + 0xc0))(*(long **)(str_local + 8),pCStack_28,i);
        str_local[0x30] = '\x10';
        str_local[0x31] = '\0';
        str_local[0x32] = '\0';
        str_local[0x33] = '\0';
        this_00 = GetValidateErrorKeyword(kValidateErrorAdditionalProperties);
        pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_00);
        *(Ch **)(str_local + 0x28) = pCVar4;
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      *(SchemaType **)(str_local + 0x20) = this->typeless_;
      this_local._7_1_ = true;
    }
  }
  else {
    if (*(int *)(str_local + 0x70) == 0) {
      *(SchemaType **)(str_local + 0x20) = this->additionalPropertiesSchema_;
    }
    else {
      pSVar2 = this->additionalPropertiesSchema_;
      uVar1 = *(uint *)(str_local + 0x70);
      *(uint *)(str_local + 0x70) = uVar1 + 1;
      *(SchemaType **)(*(long *)(str_local + 0x68) + (ulong)uVar1 * 8) = pSVar2;
      *(SchemaType **)(str_local + 0x20) = this->typeless_;
      str_local[0x74] = '\x02';
      str_local[0x75] = '\0';
      str_local[0x76] = '\0';
      str_local[0x77] = '\0';
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Key(Context& context, const Ch* str, SizeType len, bool) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::Key", str);

        if (patternProperties_) {
            context.patternPropertiesSchemaCount = 0;
            for (SizeType i = 0; i < patternPropertyCount_; i++)
                if (patternProperties_[i].pattern && IsPatternMatch(patternProperties_[i].pattern, str, len)) {
                    context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = patternProperties_[i].schema;
                    context.valueSchema = typeless_;
                }
        }

        SizeType index  = 0;
        if (FindPropertyIndex(ValueType(str, len).Move(), &index)) {
            if (context.patternPropertiesSchemaCount > 0) {
                context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = properties_[index].schema;
                context.valueSchema = typeless_;
                context.valuePatternValidatorType = Context::kPatternValidatorWithProperty;
            }
            else
                context.valueSchema = properties_[index].schema;

            if (context.propertyExist)
                context.propertyExist[index] = true;

            return true;
        }

        if (additionalPropertiesSchema_) {
            if (context.patternPropertiesSchemaCount > 0) {
                context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = additionalPropertiesSchema_;
                context.valueSchema = typeless_;
                context.valuePatternValidatorType = Context::kPatternValidatorWithAdditionalProperty;
            }
            else
                context.valueSchema = additionalPropertiesSchema_;
            return true;
        }
        else if (additionalProperties_) {
            context.valueSchema = typeless_;
            return true;
        }

        if (context.patternPropertiesSchemaCount == 0) { // patternProperties are not additional properties
            // Must set valueSchema for when kValidateContinueOnErrorFlag is set, else reports spurious type error
            context.valueSchema = typeless_;
            context.error_handler.DisallowedProperty(str, len);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAdditionalProperties);
        }

        return true;
    }